

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variablebyte.h
# Opt level: O0

uint8_t * __thiscall
FastPForLib::VariableByte::decodeFromByteArray<unsigned_long>
          (VariableByte *this,uint8_t *inbyte,size_t length,unsigned_long *out,size_t *nvalue)

{
  byte *pbVar1;
  uint8_t *puVar2;
  ulong uVar3;
  uint64_t c_1;
  unsigned_long v_1;
  uint shift;
  unsigned_long v;
  uint64_t c;
  unsigned_long *initout;
  uint8_t *endbyte;
  size_t *nvalue_local;
  unsigned_long *out_local;
  size_t length_local;
  uint8_t *inbyte_local;
  VariableByte *this_local;
  uint8_t *local_8;
  
  if (length == 0) {
    *nvalue = 0;
    local_8 = inbyte;
  }
  else {
    puVar2 = inbyte + length;
    out_local = out;
    inbyte_local = inbyte;
    while (inbyte_local + 10 < puVar2) {
      uVar3 = (ulong)*inbyte_local & 0x7f;
      if ((ulong)*inbyte_local < 0x80) {
        uVar3 = ((ulong)inbyte_local[1] & 0x7f) << 7 | uVar3;
        if ((ulong)inbyte_local[1] < 0x80) {
          uVar3 = ((ulong)inbyte_local[2] & 0x7f) << 0xe | uVar3;
          if ((ulong)inbyte_local[2] < 0x80) {
            uVar3 = ((ulong)inbyte_local[3] & 0x7f) << 0x15 | uVar3;
            if ((ulong)inbyte_local[3] < 0x80) {
              uVar3 = ((ulong)inbyte_local[4] & 0x7f) << 0x1c | uVar3;
              if ((ulong)inbyte_local[4] < 0x80) {
                uVar3 = ((ulong)inbyte_local[5] & 0x7f) << 0x23 | uVar3;
                if ((ulong)inbyte_local[5] < 0x80) {
                  uVar3 = ((ulong)inbyte_local[6] & 0x7f) << 0x2a | uVar3;
                  if ((ulong)inbyte_local[6] < 0x80) {
                    uVar3 = ((ulong)inbyte_local[7] & 0x7f) << 0x31 | uVar3;
                    if ((ulong)inbyte_local[7] < 0x80) {
                      uVar3 = (ulong)(inbyte_local[8] & 0x7f) << 0x38 | uVar3;
                      if (inbyte_local[8] < 0x80) {
                        pbVar1 = inbyte_local + 9;
                        inbyte_local = inbyte_local + 10;
                        *out_local = (ulong)*pbVar1 << 0x3f | uVar3;
                        out_local = out_local + 1;
                      }
                      else {
                        inbyte_local = inbyte_local + 9;
                        *out_local = uVar3;
                        out_local = out_local + 1;
                      }
                    }
                    else {
                      inbyte_local = inbyte_local + 8;
                      *out_local = uVar3;
                      out_local = out_local + 1;
                    }
                  }
                  else {
                    inbyte_local = inbyte_local + 7;
                    *out_local = uVar3;
                    out_local = out_local + 1;
                  }
                }
                else {
                  inbyte_local = inbyte_local + 6;
                  *out_local = uVar3;
                  out_local = out_local + 1;
                }
              }
              else {
                inbyte_local = inbyte_local + 5;
                *out_local = uVar3;
                out_local = out_local + 1;
              }
            }
            else {
              inbyte_local = inbyte_local + 4;
              *out_local = uVar3;
              out_local = out_local + 1;
            }
          }
          else {
            inbyte_local = inbyte_local + 3;
            *out_local = uVar3;
            out_local = out_local + 1;
          }
        }
        else {
          inbyte_local = inbyte_local + 2;
          *out_local = uVar3;
          out_local = out_local + 1;
        }
      }
      else {
        inbyte_local = inbyte_local + 1;
        *out_local = uVar3;
        out_local = out_local + 1;
      }
    }
LAB_001f21e7:
    if (inbyte_local < puVar2) {
      shift = 0;
      v_1 = 0;
      while (inbyte_local < puVar2) {
        v_1 = (((ulong)*inbyte_local & 0x7f) << ((byte)shift & 0x3f)) + v_1;
        if ((*inbyte_local & 0x80) != 0) {
          *out_local = v_1;
          out_local = out_local + 1;
          inbyte_local = inbyte_local + 1;
          break;
        }
        shift = shift + 7;
        inbyte_local = inbyte_local + 1;
      }
      goto LAB_001f21e7;
    }
    *nvalue = (long)out_local - (long)out >> 3;
    local_8 = inbyte_local;
  }
  return local_8;
}

Assistant:

const uint8_t *decodeFromByteArray(const uint8_t *inbyte, const size_t length,
                                     T *out, size_t &nvalue) {
    if (length == 0) {
      nvalue = 0;
      return inbyte;  // abort
    }
    const uint8_t *const endbyte = inbyte + length;
    const T *const initout(out);
    // this assumes that there is a value to be read

    while (endbyte > inbyte + 10) {
      uint64_t c;
      T v = 0;

      c = inbyte[0];
      v = c & 0x7F;
      if (c >= 128) {
        inbyte += 1;
        *out++ = v;
        continue;
      }

      c = inbyte[1];
      v |= (c & 0x7F) << 7;
      if (c >= 128) {
        inbyte += 2;
        *out++ = v;
        continue;
      }

      c = inbyte[2];
      v |= (c & 0x7F) << 14;
      if (c >= 128) {
        inbyte += 3;
        *out++ = v;
        continue;
      }

      c = inbyte[3];
      v |= (c & 0x7F) << 21;
      if (c >= 128) {
        inbyte += 4;
        *out++ = v;
        continue;
      }

      c = inbyte[4];
      v |= (c & 0x7F) << 28;
      if (c >= 128) {
        inbyte += 5;
        *out++ = v;
        continue;
      }

      c = inbyte[5];
      v |= static_cast<uint64_t>(c & 0x7F) << 35;
      if (c >= 128) {
        inbyte += 6;
        *out++ = v;
        continue;
      }

      c = inbyte[6];
      v |= static_cast<uint64_t>(c & 0x7F) << 42;
      if (c >= 128) {
        inbyte += 7;
        *out++ = v;
        continue;
      }

      c = inbyte[7];
      v |= static_cast<uint64_t>(c & 0x7F) << 49;
      if (c >= 128) {
        inbyte += 8;
        *out++ = v;
        continue;
      }

      c = inbyte[8];
      v |= static_cast<uint64_t>(c & 0x7F) << 56;
      if (c >= 128) {
        inbyte += 9;
        *out++ = v;
        continue;
      }

      c = inbyte[9];
      inbyte += 10;
      v |= static_cast<uint64_t>(c & 0x1) << 63;
      *out++ = v;
    }

    while (endbyte > inbyte) {
      unsigned int shift = 0;
      for (T v = 0; endbyte > inbyte; shift += 7) {
        uint64_t c = *inbyte++;
        v += ((c & 127) << shift);
        if ((c & 128)) {
          *out++ = v;
          break;
        }
      }
    }
    nvalue = out - initout;
    return inbyte;
  }